

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yabmpconvert_topng.c
# Opt level: O1

int convert_topng(yabmpconvert_parameters *parameters,yabmp *bmp_reader,yabmp_info *bmp_info)

{
  char *__filename;
  yabmp_malloc_cb p_Var1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  FILE *__stream;
  __jmp_buf_tag *__env;
  size_t sVar7;
  void *__ptr;
  int iVar8;
  ulong uVar9;
  undefined8 unaff_RBP;
  undefined8 *puVar10;
  size_t sVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  png_structp l_png_writer;
  yabmp_uint32 l_height;
  png_infop l_png_info;
  uint red_bits;
  uint blue_bits;
  uint l_bit_depth;
  void *l_buffer;
  uint alpha_bits;
  uint green_bits;
  yabmp_q16d16 gb;
  yabmp_q16d16 gg;
  yabmp_q16d16 gr;
  uint l_color_profile_intent;
  uint l_color_profile_type;
  uint l_scan_direction;
  yabmp_uint32 l_compression_type;
  uint l_color_type;
  yabmp_uint32 l_res_y;
  yabmp_uint32 l_res_x;
  yabmp_uint32 l_width;
  yabmp_color *l_bmp_palette;
  uint l_num_palette;
  png_color l_png_palette [256];
  ulong in_stack_fffffffffffffc20;
  long local_3d0;
  uint local_3c8;
  char local_3c1;
  long local_3c0;
  uint local_3b8;
  int local_3b4;
  int local_3b0;
  int local_3ac;
  void *local_3a8;
  int local_3a0;
  int local_39c;
  size_t local_398;
  int local_38c;
  int local_388;
  int local_384;
  uint local_380;
  int local_37c;
  int local_378;
  int local_374;
  uint local_370;
  int local_36c;
  int local_368;
  undefined4 local_364;
  void *local_360;
  char **local_358;
  uint local_350;
  uint uStack_34c;
  uint local_348;
  uint local_344;
  uint local_340;
  undefined8 local_338;
  uint local_330;
  
  local_3a8 = (void *)0x0;
  local_3d0 = 0;
  local_3c0 = 0;
  if (parameters == (yabmpconvert_parameters *)0x0) {
    __assert_fail("parameters != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/mayeut[P]yabmp/bin/yabmpconvert/yabmpconvert_topng.c"
                  ,0x79,"int convert_topng(const yabmpconvert_parameters *, yabmp *, yabmp_info *)")
    ;
  }
  if (bmp_reader == (yabmp *)0x0) {
    __assert_fail("bmp_reader != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/mayeut[P]yabmp/bin/yabmpconvert/yabmpconvert_topng.c"
                  ,0x7a,"int convert_topng(const yabmpconvert_parameters *, yabmp *, yabmp_info *)")
    ;
  }
  if (bmp_info == (yabmp_info *)0x0) {
    __assert_fail("bmp_info != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/mayeut[P]yabmp/bin/yabmpconvert/yabmpconvert_topng.c"
                  ,0x7b,"int convert_topng(const yabmpconvert_parameters *, yabmp *, yabmp_info *)")
    ;
  }
  yabmp_get_color_type(bmp_reader,bmp_info,&local_370);
  yabmp_get_compression_type(bmp_reader,bmp_info,&local_374);
  yabmp_get_scan_direction(bmp_reader,bmp_info,&local_378);
  yabmp_get_color_profile_type(bmp_reader,bmp_info,&local_37c);
  yabmp_get_color_profile_intent(bmp_reader,bmp_info,&local_380);
  switch(local_370) {
  case 1:
    if ((parameters->field_0x20 & 8) != 0) goto switchD_00102f69_caseD_a;
    if ((parameters->field_0x20 & 0x10) == 0) {
      yabmp_set_expand_to_grayscale(bmp_reader);
    }
    break;
  case 2:
    break;
  case 3:
    if ((parameters->field_0x20 & 8) != 0) goto switchD_00102f69_caseD_a;
    break;
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
switchD_00102f69_caseD_4:
    if ((parameters->field_0x20 & 4) != 0) {
      return 1;
    }
    convert_topng_cold_8();
    return 1;
  default:
    if (local_370 != 0xe) goto switchD_00102f69_caseD_4;
  case 10:
switchD_00102f69_caseD_a:
    yabmp_set_expand_to_bgrx(bmp_reader);
  }
  uVar9 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  if (local_378 == 0) {
    if ((local_374 == 0) && ((parameters->field_0x20 & 0x20) == 0)) {
      iVar5 = yabmp_set_invert_scan_direction(bmp_reader);
      uVar9 = uVar9 & 0xffffffff;
      if (iVar5 != 0) {
        return 1;
      }
    }
    else {
      uVar9 = 0;
    }
  }
  else {
    uVar9 = uVar9 & 0xffffffff;
  }
  yabmp_read_update_info(bmp_reader,bmp_info);
  yabmp_get_color_type(bmp_reader,bmp_info,&local_370);
  yabmp_get_dimensions(bmp_reader,bmp_info,&local_364,&local_3c8);
  yabmp_get_pixels_per_meter(bmp_reader,bmp_info,&local_368,&local_36c);
  yabmp_get_bit_depth(bmp_reader,bmp_info,&local_3ac);
  yabmp_get_bits(bmp_reader,bmp_info,&local_3b0,&local_39c,&local_3b4,&local_3a0);
  if (6 < local_370) {
LAB_00103120:
    if ((parameters->field_0x20 & 4) != 0) {
      return 1;
    }
    convert_topng_cold_7();
    return 1;
  }
  local_3c1 = (char)uVar9;
  if ((0x45U >> (local_370 & 0x1f) & 1) == 0) {
    if ((10U >> (local_370 & 0x1f) & 1) == 0) goto LAB_00103120;
    local_370 = 3;
    iVar5 = (int)CONCAT71((int7)(uVar9 >> 8),1);
  }
  else {
    iVar5 = 0;
  }
  if ((((local_3b0 != local_3ac) || (local_39c != local_3ac)) || (local_3b4 != local_3ac)) ||
     (bVar2 = true, local_3a0 != 0 && local_3a0 != local_3ac)) {
    bVar2 = false;
  }
  local_358 = &parameters->output_file;
  __filename = parameters->output_file;
  local_3b8 = local_370;
  if (((*__filename != '-') || (__stream = _stdout, __filename[1] != '\0')) &&
     (__stream = fopen(__filename,"wb"), __stream == (FILE *)0x0)) {
    if ((parameters->field_0x20 & 4) != 0) {
      return 1;
    }
    convert_topng_cold_1();
    return 1;
  }
  uVar9 = 0;
  local_3d0 = png_create_write_struct_2
                        ("1.6.37",0,print_png_error,print_png_warning,parameters,custom_png_malloc,
                         custom_png_free);
  if (local_3d0 == 0) {
    if ((parameters->field_0x20 & 4) == 0) {
      convert_topng_cold_6();
    }
LAB_001031bf:
    iVar5 = 1;
    bVar2 = false;
    goto LAB_00103401;
  }
  __env = (__jmp_buf_tag *)png_set_longjmp_fn(local_3d0,longjmp,200);
  iVar4 = _setjmp(__env);
  if (iVar4 != 0) {
LAB_001031a7:
    bVar2 = false;
    iVar5 = 1;
    goto LAB_00103401;
  }
  png_init_io(local_3d0,__stream);
  local_3c0 = png_create_info_struct(local_3d0);
  if (local_3c0 == 0) {
    if ((parameters->field_0x20 & 4) == 0) {
      convert_topng_cold_5();
    }
  }
  else {
    png_set_IHDR(local_3d0,local_3c0,local_364,local_3c8,local_3ac,local_3b8,
                 uVar9 & 0xffffffff00000000,in_stack_fffffffffffffc20 & 0xffffffff00000000,0);
    if (local_368 != 0 || local_36c != 0) {
      png_set_pHYs(local_3d0,local_3c0,local_368,local_36c,1);
    }
    if ((char)iVar5 != '\0') {
      iVar4 = yabmp_get_palette(bmp_reader,bmp_info,&local_344,&local_350);
      iVar8 = 6;
      if (iVar4 == 0) {
        uVar9 = (ulong)local_344;
        if (0x100 < uVar9) {
          __assert_fail("l_num_palette <= 256U",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/mayeut[P]yabmp/bin/yabmpconvert/yabmpconvert_topng.c"
                        ,0x111,
                        "int convert_topng(const yabmpconvert_parameters *, yabmp *, yabmp_info *)")
          ;
        }
        if (uVar9 != 0) {
          lVar14 = CONCAT44(uStack_34c,local_350);
          lVar12 = 0;
          do {
            *(undefined1 *)((long)&local_338 + lVar12 + 2) = *(undefined1 *)(lVar14 + 2 + lVar12);
            *(undefined1 *)((long)&local_338 + lVar12 + 1) = *(undefined1 *)(lVar14 + 1 + lVar12);
            *(undefined1 *)((long)&local_338 + lVar12) = *(undefined1 *)(lVar14 + lVar12);
            lVar12 = lVar12 + 3;
          } while (uVar9 * 3 != lVar12);
        }
        png_set_PLTE(local_3d0,local_3c0,&local_338);
        iVar8 = 0;
      }
      if (iVar8 == 6) goto LAB_001033fa;
      if (iVar8 != 0) {
        return iVar5;
      }
    }
    if ((!bVar2) && ((local_3b8 & 3) == 2)) {
      local_338 = (ulong)CONCAT31(local_338._5_3_,(undefined1)local_3a0) << 0x20;
      local_338 = CONCAT71(CONCAT61(CONCAT51(local_338._3_5_,(char)local_3b0 + (local_3b0 == 0)),
                                    (char)local_39c + (local_39c == 0)),
                           (char)local_3b4 + (local_3b4 == 0));
      png_set_sBIT(local_3d0,local_3c0,&local_338);
      local_338._0_3_ = CONCAT12((char)local_3b4 + (local_3b4 == 0),(undefined2)local_338);
      local_338 = CONCAT71(local_338._1_7_,(char)local_3b0 + (local_3b0 == 0));
      png_set_shift(local_3d0,&local_338);
    }
    if (local_37c == 1) {
      if ((ulong)local_380 < 5) {
        png_set_sRGB(local_3d0,local_3c0,*(undefined4 *)(&DAT_001054a0 + (ulong)local_380 * 4));
        iVar4 = 0;
      }
      else {
        iVar5 = 6;
        if ((parameters->field_0x20 & 4) == 0) {
          convert_topng_cold_2();
        }
        iVar4 = 6;
      }
      if (iVar4 != 0) {
        if (iVar4 != 6) {
          return iVar5;
        }
        bVar2 = false;
        iVar5 = 1;
        goto LAB_00103401;
      }
    }
    else if (local_37c == 4) {
      yabmp_get_color_profile_calibration
                (bmp_reader,bmp_info,&local_338,&local_350,&local_344,&local_384,&local_388,
                 &local_38c);
      png_set_cHRM_XYZ((double)(local_338 & 0xffffffff) * 9.313225754828403e-10,
                       (double)(local_338 >> 0x20) * 9.313225754828403e-10,
                       (double)local_330 * 9.313225754828403e-10,
                       (double)local_350 * 9.313225754828403e-10,
                       (double)uStack_34c * 9.313225754828403e-10,
                       (double)local_348 * 9.313225754828403e-10,
                       (double)local_344 * 9.313225754828403e-10,
                       (double)local_340 * 9.313225754828403e-10,local_3d0,local_3c0);
      png_set_gAMA((double)(uint)(local_388 + local_384 + local_38c) * 5.086263020833333e-06,
                   local_3d0,local_3c0);
    }
    else if (local_37c == 3) {
      local_338 = 0;
      yabmp_get_color_profile_icc_data(bmp_reader,bmp_info,&local_338,&local_350);
      png_set_iCCP(local_3d0,local_3c0,"bmpiccprofile",0,local_338,local_350);
    }
    png_write_info(local_3d0,local_3c0);
    if ((local_3b8 | 4) == 6) {
      png_set_bgr(local_3d0);
    }
    if (local_3ac == 0x10) {
      png_set_swap(local_3d0);
    }
    sVar7 = png_get_rowbytes(local_3d0,local_3c0);
    puVar10 = &local_338;
    yabmp_get_rowbytes(bmp_reader,bmp_info,puVar10);
    iVar5 = 0;
    if (local_338 != sVar7) {
      puVar10 = (undefined8 *)0x6;
      if ((parameters->field_0x20 & 4) == 0) {
        convert_topng_cold_3();
      }
      iVar5 = 6;
    }
    cVar3 = local_3c1;
    if (iVar5 == 6) goto LAB_001031a7;
    if (iVar5 != 0) {
      return (int)puVar10;
    }
    p_Var1 = parameters->malloc;
    uVar6 = (uint)CONCAT71((int7)((ulong)puVar10 >> 8),local_3c1);
    local_398 = sVar7;
    if (local_3c1 == '\0') {
      sVar11 = local_3c8 * sVar7;
      if (p_Var1 == (yabmp_malloc_cb)0x0) goto LAB_001036e0;
LAB_001036c8:
      __ptr = (*p_Var1)((void *)0x0,sVar11);
    }
    else {
      sVar11 = sVar7;
      if (p_Var1 != (yabmp_malloc_cb)0x0) goto LAB_001036c8;
LAB_001036e0:
      __ptr = malloc(sVar11);
    }
    local_3a8 = __ptr;
    if (__ptr != (void *)0x0) {
      if (cVar3 == '\0') {
        local_360 = __ptr;
        if (local_3c8 != 0) {
          uVar6 = 0;
          do {
            iVar5 = yabmp_read_row(bmp_reader,__ptr,local_398);
            if (iVar5 != 0) {
              iVar5 = 6;
              goto LAB_001037fb;
            }
            __ptr = (void *)((long)__ptr + sVar7);
            uVar6 = uVar6 + 1;
          } while (uVar6 < local_3c8);
        }
        if (local_3c8 == 0) {
          iVar5 = 0;
        }
        else {
          lVar14 = (long)__ptr - sVar7;
          uVar13 = 0;
          uVar6 = 0;
          do {
            png_write_row(local_3d0,lVar14);
            uVar13 = uVar13 + 1;
            lVar14 = lVar14 - sVar7;
          } while (uVar13 < local_3c8);
          iVar5 = 0;
        }
LAB_001037fb:
        __ptr = local_360;
        if (iVar5 != 0) {
          if (iVar5 != 6) {
            return uVar6;
          }
          goto LAB_001033fa;
        }
      }
      else {
        if (local_3c8 != 0) {
          uVar6 = 0;
          do {
            iVar5 = yabmp_read_row(bmp_reader,__ptr,local_398);
            if (iVar5 != 0) {
              iVar5 = 6;
              goto LAB_001037cc;
            }
            png_write_row(local_3d0,__ptr);
            uVar6 = uVar6 + 1;
          } while (uVar6 < local_3c8);
        }
        iVar5 = 0;
LAB_001037cc:
        if (iVar5 == 6) goto LAB_001031bf;
        if (iVar5 != 0) {
          return 1;
        }
      }
      if (parameters->free == (yabmp_free_cb)0x0) {
        free(__ptr);
      }
      else {
        (*parameters->free)((void *)0x0,__ptr);
      }
      local_3a8 = (void *)0x0;
      iVar5 = 0;
      png_write_end(local_3d0,0);
      bVar2 = true;
      goto LAB_00103401;
    }
    if ((parameters->field_0x20 & 4) == 0) {
      convert_topng_cold_4();
    }
  }
LAB_001033fa:
  bVar2 = false;
  iVar5 = 1;
LAB_00103401:
  if (local_3d0 != 0) {
    png_destroy_write_struct(&local_3d0,&local_3c0);
  }
  if (((__stream != (FILE *)0x0) && (__stream != _stdout)) && (fclose(__stream), !bVar2)) {
    remove(*local_358);
  }
  if (local_3a8 != (void *)0x0) {
    if (parameters->free == (yabmp_free_cb)0x0) {
      free(local_3a8);
    }
    else {
      (*parameters->free)((void *)0x0,local_3a8);
    }
  }
  return iVar5;
}

Assistant:

int convert_topng(const yabmpconvert_parameters* parameters, yabmp* bmp_reader, yabmp_info* bmp_info)
{
	int result = EXIT_FAILURE; /* default is fail */
	void* volatile l_buffer = NULL; /* volatile needed because of long jump */
	void* l_buffer_cache;
	size_t l_buffer_size;
	yabmp_uint32 l_width, l_height;
	yabmp_uint32 l_res_x, l_res_y;
	unsigned int l_bit_depth;
	unsigned int l_color_type;
	yabmp_uint32 l_compression_type;
	unsigned int l_scan_direction;
	yabmp_uint32 l_png_color_mask;
	int l_png_has_sBIT = 0;
	unsigned int blue_bits, green_bits, red_bits, alpha_bits;
	unsigned int l_color_profile_type, l_color_profile_intent;
	int l_need_full_image = 0;
		
	png_structp l_png_writer = NULL;
	png_infop l_png_info = NULL;
	FILE* l_output = NULL;
	
	assert(parameters != NULL);
	assert(bmp_reader != NULL);
	assert(bmp_info != NULL);
	
	/* Those calls can't fail with proper arguments */
	(void)yabmp_get_color_type(bmp_reader, bmp_info, &l_color_type);
	(void)yabmp_get_compression_type(bmp_reader, bmp_info, &l_compression_type);
	(void)yabmp_get_scan_direction(bmp_reader, bmp_info, &l_scan_direction);
	(void)yabmp_get_color_profile_type(bmp_reader, bmp_info, &l_color_profile_type);
	(void)yabmp_get_color_profile_intent(bmp_reader, bmp_info, &l_color_profile_intent);
	
	/* Check transforms needed */
	switch (l_color_type)
	{
		case YABMP_COLOR_TYPE_BGR:
			break;
		case YABMP_COLOR_TYPE_BITFIELDS:
			yabmp_set_expand_to_bgrx(bmp_reader); /* always expand to BGR(A) */
			break;
		case YABMP_COLOR_TYPE_BITFIELDS_ALPHA:
			yabmp_set_expand_to_bgrx(bmp_reader); /* always expand to BGR(A) */
			break;
		case YABMP_COLOR_TYPE_PALETTE:
			if (parameters->expand_palette) {
				yabmp_set_expand_to_bgrx(bmp_reader); /* expand to BGR(A) */
			}
			break;
		case YABMP_COLOR_TYPE_GRAY_PALETTE:
			if (parameters->expand_palette) {
				yabmp_set_expand_to_bgrx(bmp_reader); /* always expand to BGR(A) */
			} else if (parameters->keep_gray_palette) {
				/* Nothing to do */
			} else {
				yabmp_set_expand_to_grayscale(bmp_reader); /* always expand to Y8 */
			}
			break;
		default:
			if (!parameters->quiet) {
				fprintf(stderr, "ERROR: Transcoding not supported.\n");
			}
			return EXIT_FAILURE;
	}
	switch (l_scan_direction)
	{
		case YABMP_SCAN_BOTTOM_UP:
			switch (l_compression_type) {
				case YABMP_COMPRESSION_NONE:
					if (parameters->no_seek_fn) {
						/* no seek for stdin */
						l_need_full_image = 1;
					} else {
						if (yabmp_set_invert_scan_direction(bmp_reader) != YABMP_OK) {
							return EXIT_FAILURE;
						}
					}
					break;
				default:
					l_need_full_image = 1;
					break;
			}
			break;
		default:
		case YABMP_SCAN_TOP_DOWN:
			break;
	}
	/* Update infos & set PNG parameters */
	yabmp_read_update_info(bmp_reader, bmp_info);
	
	(void)yabmp_get_color_type(bmp_reader, bmp_info, &l_color_type);
	(void)yabmp_get_dimensions(bmp_reader, bmp_info, &l_width, &l_height);
	(void)yabmp_get_pixels_per_meter(bmp_reader, bmp_info, &l_res_x, &l_res_y);
	(void)yabmp_get_bit_depth(bmp_reader, bmp_info, &l_bit_depth);
	(void)yabmp_get_bits(bmp_reader, bmp_info, &blue_bits, &green_bits, &red_bits, &alpha_bits);
	
	switch (l_color_type)
	{
		case YABMP_COLOR_TYPE_BGR:
			l_png_color_mask = PNG_COLOR_TYPE_RGB;
			break;
		case YABMP_COLOR_TYPE_BGR_ALPHA:
			l_png_color_mask = PNG_COLOR_TYPE_RGB_ALPHA;
			break;
		case YABMP_COLOR_TYPE_PALETTE:
		case YABMP_COLOR_TYPE_GRAY_PALETTE:
				l_png_color_mask = PNG_COLOR_TYPE_PALETTE;
			break;
		case YABMP_COLOR_TYPE_GRAY:
				l_png_color_mask = PNG_COLOR_TYPE_GRAY;
			break;
		default:
			if (!parameters->quiet) {
				fprintf(stderr, "ERROR: Transcoding not supported.\n");
			}
			return EXIT_FAILURE;
	}
	
	if (
			(blue_bits != l_bit_depth) ||
			(green_bits != l_bit_depth) ||
			(red_bits != l_bit_depth) ||
			((alpha_bits != l_bit_depth) && (alpha_bits != 0))) {
		l_png_has_sBIT = 1;
	}
	
	if ((parameters->output_file[0] == '-') && (parameters->output_file[1] == '\0')) {
		stream_setmode_binary(stdout, parameters->quiet);
		l_output = stdout;
	}
	else {
		l_output = fopen(parameters->output_file, "wb");
		if (l_output == NULL) {
			if (!parameters->quiet) {
				fprintf(stderr, "ERROR: can't open file %s for writing\n", parameters->output_file);
			}
			return EXIT_FAILURE;
		}
	}
	
	l_png_writer = png_create_write_struct_2(PNG_LIBPNG_VER_STRING, NULL, print_png_error, print_png_warning, (png_voidp)parameters, custom_png_malloc, custom_png_free);
	if (l_png_writer == NULL) {
		if (!parameters->quiet) {
			fprintf(stderr, "ERROR: can't create PNG struct\n");
		}
		goto BADEND;
	}
	if (setjmp(png_jmpbuf(l_png_writer))) {
		goto BADEND;
	}
	/* errors here will generate long jump */
	png_init_io(l_png_writer, l_output);
	l_png_info = png_create_info_struct(l_png_writer);
	if (l_png_info == NULL) {
		if (!parameters->quiet) {
			fprintf(stderr, "ERROR: can't create PNG info struct\n");
		}
		goto BADEND;
	}
		
	png_set_IHDR(l_png_writer, l_png_info, l_width, l_height, (int)l_bit_depth, l_png_color_mask, PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_DEFAULT, PNG_FILTER_TYPE_DEFAULT);
	
	if ((l_res_x != 0U) || (l_res_y != 0U)) {
		png_set_pHYs(l_png_writer, l_png_info, l_res_x, l_res_y, PNG_RESOLUTION_METER);
	}
	
	if (l_png_color_mask == PNG_COLOR_TYPE_PALETTE) {
		unsigned int i, l_num_palette;
		const yabmp_color *l_bmp_palette;
		png_color l_png_palette[256];
		
		if(yabmp_get_palette(bmp_reader, bmp_info, &l_num_palette, &l_bmp_palette) != YABMP_OK) {
			goto BADEND;
		}
		assert(l_num_palette <= 256U);
		for (i = 0U; i < l_num_palette; ++i) {
			l_png_palette[i].blue  = l_bmp_palette[i].blue;
			l_png_palette[i].green = l_bmp_palette[i].green;
			l_png_palette[i].red   = l_bmp_palette[i].red;
		}
		
		png_set_PLTE(l_png_writer, l_png_info, l_png_palette, (int)l_num_palette);
	}
		
	if (l_png_has_sBIT) {
		png_color_8 l_sBIT;
		
		if ((l_png_color_mask & ~PNG_COLOR_MASK_ALPHA) == PNG_COLOR_TYPE_RGB) {
			l_sBIT.alpha = alpha_bits;
			l_sBIT.gray  = 0U;
			l_sBIT.blue  = blue_bits ? blue_bits : 1; /* 0 is forbidden, transform deadlocks */
			l_sBIT.green = green_bits ? green_bits : 1;
			l_sBIT.red   = red_bits ? red_bits : 1;
			png_set_sBIT(l_png_writer, l_png_info, &l_sBIT);
			
			/* because of png_set_bgr */
			l_sBIT.blue  = red_bits ? red_bits : 1;
			l_sBIT.red   = blue_bits ? blue_bits : 1;
			png_set_shift(l_png_writer, &l_sBIT);
		}
	}
	
	switch (l_color_profile_type) {
		case YABMP_COLOR_PROFILE_ICC_EMBEDDED:
			{
				yabmp_uint8 const* l_icc_profile = NULL;
				yabmp_uint32 l_icc_profile_len;
				(void)yabmp_get_color_profile_icc_data(bmp_reader, bmp_info, &l_icc_profile, &l_icc_profile_len);
				png_set_iCCP(l_png_writer, l_png_info, "bmpiccprofile", 0, l_icc_profile, l_icc_profile_len);
			}
			break;
		case YABMP_COLOR_PROFILE_sRGB:
			{
				int srgb_intent;
				switch (l_color_profile_intent) {
					case YABMP_COLOR_PROFILE_INTENT_NONE:
					case YABMP_COLOR_PROFILE_INTENT_PERCEPTUAL:
						srgb_intent = 0;
						break;
					case YABMP_COLOR_PROFILE_INTENT_RELCOL:
						srgb_intent = 1;
						break;
					case YABMP_COLOR_PROFILE_INTENT_SATURATION:
						srgb_intent = 2;
						break;
					case YABMP_COLOR_PROFILE_INTENT_ABSCOL:
						srgb_intent = 3;
						break;
					default:
						if (!parameters->quiet) {
							fprintf(stderr, "ERROR: invalid intent\n");
						}
						goto BADEND;
						break;
				}
				png_set_sRGB(l_png_writer, l_png_info, srgb_intent);
			}
			break;
		case YABMP_COLOR_PROFILE_CALIBRATED_RGB:
			{
				yabmp_cie_xyz r, g, b;
				yabmp_q16d16 gr, gg, gb;
				(void)yabmp_get_color_profile_calibration(bmp_reader, bmp_info, &r, &g, &b, &gr, &gg, &gb);
				png_set_cHRM_XYZ(l_png_writer, l_png_info, r.x * (1.0 / 1073741823.0), r.y * (1.0 / 1073741823.0), r.z * (1.0 / 1073741823.0), g.x * (1.0 / 1073741823.0), g.y * (1.0 / 1073741823.0), g.z * (1.0 / 1073741823.0), b.x * (1.0 / 1073741823.0), b.y * (1.0 / 1073741823.0), b.z * (1.0 / 1073741823.0));
				/* how to handle per channel gamma ? */
				/* let's just average for now... */
				png_set_gAMA(l_png_writer, l_png_info, (gr + gg + gb) * (1.0 / (3.0 * 65536.0)));
			}
			break;
		default:
			break;
	}
	
	png_write_info(l_png_writer, l_png_info);
		
	switch (l_png_color_mask) {
		case PNG_COLOR_TYPE_RGB:
		case PNG_COLOR_TYPE_RGB_ALPHA:
			png_set_bgr(l_png_writer);
			break;
		default:
			break;
	}
#if !defined(YABMP_BIG_ENDIAN)
	if (l_bit_depth == 16U) {
		png_set_swap(l_png_writer);
	}
#endif
	
	/* Now deal with the image */
	l_buffer_size = png_get_rowbytes(l_png_writer, l_png_info);
	{
		size_t l_check_buffer_size;
		yabmp_get_rowbytes(bmp_reader, bmp_info, &l_check_buffer_size);
		if (l_check_buffer_size != l_buffer_size) {
			if (!parameters->quiet) {
				fprintf(stderr, "ERROR: row bytes not matching between YABMP & PNG\n");
			}
			goto BADEND;
		}
	}
	if (l_need_full_image) {
		/* TODO check overflow */
		l_buffer = l_buffer_cache = parameters->malloc ? parameters->malloc(NULL, l_buffer_size * (size_t)l_height) : malloc(l_buffer_size * (size_t)l_height);
	}
	else {
		l_buffer = l_buffer_cache = parameters->malloc ? parameters->malloc(NULL, l_buffer_size): malloc(l_buffer_size);
	}
	if (l_buffer_cache == NULL) {
		if (!parameters->quiet) {
			fprintf(stderr, "ERROR: can't allocate buffer for 1 line\n");
		}
		goto BADEND;
	}
	if (l_need_full_image) {
		union
		{
			void* buffer;
			yabmp_uint8* buffer8u;
		} l_current_row;
		yabmp_uint32 i;
		
		l_current_row.buffer = l_buffer_cache;
		for (i = 0U; i < l_height; ++i) {
			if (yabmp_read_row(bmp_reader, l_current_row.buffer, l_buffer_size) != YABMP_OK) {
				goto BADEND;
			}
			l_current_row.buffer8u += l_buffer_size;
		}
		for (i = 0U; i < l_height; ++i) {
			l_current_row.buffer8u -= l_buffer_size;
			png_write_row(l_png_writer, l_current_row.buffer);
		}
	}
	else {
		yabmp_uint32 i;
		for (i = 0U; i < l_height; ++i) {
			if (yabmp_read_row(bmp_reader, l_buffer_cache, l_buffer_size) != YABMP_OK) {
				goto BADEND;
			}
			png_write_row(l_png_writer, l_buffer_cache);
		}
	}
	parameters->free ? parameters->free(NULL, l_buffer_cache) : free(l_buffer_cache);
	l_buffer = NULL;
		
	png_write_end(l_png_writer, NULL);
	result = 0;
BADEND:
	if (l_png_writer != NULL) {
		png_destroy_write_struct(&l_png_writer, &l_png_info);
	}
	if ((l_output != NULL) && (l_output != stdout)) {
		fclose(l_output);
		if (result != 0) {
			(void)remove(parameters->output_file);
		}
	}
	l_buffer_cache = l_buffer;
	if (l_buffer_cache != NULL) {
		parameters->free ? parameters->free(NULL, l_buffer_cache) : free(l_buffer_cache);
		l_buffer = NULL;
	}
	return result;
}